

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32 png_get_x_pixels_per_meter(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  png_const_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_const_inforp)0x0)) ||
      ((info_ptr->valid & 0x80) == 0)) || (info_ptr->phys_unit_type != '\x01')) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    png_ptr_local._4_4_ = info_ptr->x_pixels_per_unit;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_x_pixels_per_meter(png_const_structrp png_ptr, png_const_inforp
   info_ptr)
{
#ifdef PNG_pHYs_SUPPORTED
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_pHYs) != 0)
      {
         png_debug1(1, "in %s retrieval function",
             "png_get_x_pixels_per_meter");

         if (info_ptr->phys_unit_type == PNG_RESOLUTION_METER)
            return (info_ptr->x_pixels_per_unit);
      }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return (0);
}